

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

void Dar_BalancePushUniqueOrderByLevel(Vec_Ptr_t *vStore,Aig_Obj_t *pObj,int fExor)

{
  Aig_Obj_t *p;
  Aig_Obj_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_34;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  int fExor_local;
  Aig_Obj_t *pObj_local;
  Vec_Ptr_t *vStore_local;
  
  iVar1 = Vec_PtrPushUnique(vStore,pObj);
  if (iVar1 == 0) {
    iVar1 = vStore->nSize;
    while (local_34 = iVar1 + -1, 0 < local_34) {
      p = (Aig_Obj_t *)vStore->pArray[local_34];
      p_00 = (Aig_Obj_t *)vStore->pArray[iVar1 + -2];
      pAVar4 = Aig_Regular(p);
      iVar2 = Aig_ObjLevel(pAVar4);
      pAVar4 = Aig_Regular(p_00);
      iVar3 = Aig_ObjLevel(pAVar4);
      if (iVar2 <= iVar3) {
        return;
      }
      vStore->pArray[local_34] = p_00;
      vStore->pArray[iVar1 + -2] = p;
      iVar1 = local_34;
    }
  }
  else if (fExor != 0) {
    Vec_PtrRemove(vStore,pObj);
  }
  return;
}

Assistant:

void Dar_BalancePushUniqueOrderByLevel( Vec_Ptr_t * vStore, Aig_Obj_t * pObj, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i;
    if ( Vec_PtrPushUnique(vStore, pObj) )
    {
        if ( fExor )
            Vec_PtrRemove(vStore, pObj);
        return;
    }
    // find the p of the node
    for ( i = vStore->nSize-1; i > 0; i-- )
    {
        pObj1 = (Aig_Obj_t *)vStore->pArray[i  ];
        pObj2 = (Aig_Obj_t *)vStore->pArray[i-1];
        if ( Aig_ObjLevel(Aig_Regular(pObj1)) <= Aig_ObjLevel(Aig_Regular(pObj2)) )
            break;
        vStore->pArray[i  ] = pObj2;
        vStore->pArray[i-1] = pObj1;
    }
}